

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_sharded.hpp
# Opt level: O3

shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
 __thiscall
ylt::util::
map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_hash<137UL>_>
::find(map_sharded_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::value_type>_>_>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::my_hash<137UL>_>
       *this,key_type *key)

{
  long lVar1;
  uint uVar2;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  *__range4;
  long *in_RDX;
  long lVar3;
  long lVar4;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
  sVar5;
  
  uVar2 = 0;
  lVar3 = 0;
  do {
    lVar1 = *(long *)(*in_RDX + 8 + lVar3);
    if (lVar1 != 0) {
      lVar4 = 0;
      do {
        uVar2 = uVar2 * 0x89 + (int)*(char *)(*(long *)(*in_RDX + lVar3) + lVar4);
        lVar4 = lVar4 + 1;
      } while (lVar1 != lVar4);
    }
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x40);
  sVar5 = internal::
          map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)'\x02'>::value_type>_>_>_>
          ::find((map_lock_t<std::unordered_map<std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::value_type,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::my_hash<131UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::my_equal,_std::allocator<std::pair<const_std::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>,_ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::value_type>_>_>_>
                  *)this,(key_type *)
                         (&key->_M_ptr->_M_dataplus +
                         ((ulong)uVar2 % (ulong)((long)key[1]._M_ptr - (long)key->_M_ptr >> 4)) * 2)
                );
  sVar5.
  super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair>
          )sVar5.
           super___shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<double>,_(unsigned_char)__x02_>::metric_pair,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<typename mapped_type::element_type> find(
      const key_type& key) const {
    return get_sharded(Hash{}(key)).find(key);
  }